

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HouseholderSequence.h
# Opt level: O2

void __thiscall
Eigen::HouseholderSequence<Eigen::Matrix<float,-1,8,0,-1,8>,Eigen::Matrix<float,-1,1,0,8,1>,1>::
applyThisOnTheLeft<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Matrix<float,1,1,1,1,1>>
          (HouseholderSequence<Eigen::Matrix<float,_1,8,0,_1,8>,Eigen::Matrix<float,_1,1,0,8,1>,1>
           *this,Matrix<float,__1,_1,_0,__1,_1> *dst,Matrix<float,_1,_1,_1,_1,_1> *workspace,
          bool inputIsIdentity)

{
  HouseholderSequence<Eigen::Matrix<float,_1,8,0,_1,8>,Eigen::Matrix<float,_1,1,0,8,1>,1> HVar1;
  long cCols;
  long cRows;
  long k_00;
  Index k;
  long lVar2;
  long lVar3;
  EssentialVectorType local_a0;
  MatrixBase<Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,_1,false>> local_68 [56];
  
  HVar1 = this[0x10];
  lVar3 = -1;
  for (lVar2 = 0; lVar2 < *(long *)(this + 0x18); lVar2 = lVar2 + 1) {
    k_00 = *(long *)(this + 0x18) + lVar3;
    if (this[0x10] !=
        (HouseholderSequence<Eigen::Matrix<float,_1,8,0,_1,8>,Eigen::Matrix<float,_1,1,0,8,1>,1>)0x0
       ) {
      k_00 = lVar2;
    }
    cRows = *(long *)(*(long *)this + 8) - (*(long *)(this + 0x20) + k_00);
    cCols = 1;
    if ((((byte)HVar1 ^ 1) & inputIsIdentity) != 0) {
      cCols = cRows;
    }
    DenseBase<Eigen::Matrix<float,-1,1,0,-1,1>>::bottomRightCorner<long,long>
              ((Type *)local_68,(DenseBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)dst,cRows,cCols);
    HouseholderSequence<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_Eigen::Matrix<float,_-1,_1,_0,_8,_1>,_1>
    ::essentialVector(&local_a0,
                      (HouseholderSequence<Eigen::Matrix<float,__1,_8,_0,__1,_8>,_Eigen::Matrix<float,__1,_1,_0,_8,_1>,_1>
                       *)this,k_00);
    MatrixBase<Eigen::Block<Eigen::Matrix<float,-1,1,0,-1,1>,-1,-1,false>>::
    applyHouseholderOnTheLeft<Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>const,_1,1,false>>
              (local_68,&local_a0,(Scalar *)(k_00 * 4 + *(long *)(this + 8)),(Scalar *)workspace);
    lVar3 = lVar3 + -1;
  }
  return;
}

Assistant:

inline void applyThisOnTheLeft(Dest& dst, Workspace& workspace, bool inputIsIdentity = false) const
    {
      if(inputIsIdentity && m_reverse)
        inputIsIdentity = false;
      // if the entries are large enough, then apply the reflectors by block
      if(m_length>=BlockSize && dst.cols()>1)
      {
        // Make sure we have at least 2 useful blocks, otherwise it is point-less:
        Index blockSize = m_length<Index(2*BlockSize) ? (m_length+1)/2 : Index(BlockSize);
        for(Index i = 0; i < m_length; i+=blockSize)
        {
          Index end = m_reverse ? (std::min)(m_length,i+blockSize) : m_length-i;
          Index k = m_reverse ? i : (std::max)(Index(0),end-blockSize);
          Index bs = end-k;
          Index start = k + m_shift;

          typedef Block<typename internal::remove_all<VectorsType>::type,Dynamic,Dynamic> SubVectorsType;
          SubVectorsType sub_vecs1(m_vectors.const_cast_derived(), Side==OnTheRight ? k : start,
                                                                   Side==OnTheRight ? start : k,
                                                                   Side==OnTheRight ? bs : m_vectors.rows()-start,
                                                                   Side==OnTheRight ? m_vectors.cols()-start : bs);
          typename internal::conditional<Side==OnTheRight, Transpose<SubVectorsType>, SubVectorsType&>::type sub_vecs(sub_vecs1);

          Index dstStart = dst.rows()-rows()+m_shift+k;
          Index dstRows  = rows()-m_shift-k;
          Block<Dest,Dynamic,Dynamic> sub_dst(dst,
                                              dstStart,
                                              inputIsIdentity ? dstStart : 0,
                                              dstRows,
                                              inputIsIdentity ? dstRows : dst.cols());
          apply_block_householder_on_the_left(sub_dst, sub_vecs, m_coeffs.segment(k, bs), !m_reverse);
        }
      }
      else
      {
        workspace.resize(dst.cols());
        for(Index k = 0; k < m_length; ++k)
        {
          Index actual_k = m_reverse ? k : m_length-k-1;
          Index dstStart = rows()-m_shift-actual_k;
          dst.bottomRightCorner(dstStart, inputIsIdentity ? dstStart : dst.cols())
            .applyHouseholderOnTheLeft(essentialVector(actual_k), m_coeffs.coeff(actual_k), workspace.data());
        }
      }
    }